

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>::cleanup
          (SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *this,
          EVP_PKEY_CTX *ctx)

{
  pointer this_00;
  long lVar1;
  
  this_00 = this->data_;
  if (this->len != 0) {
    lVar1 = this->len * 0x98;
    do {
      SmallVectorBase<slang::SmallVector<int,_10UL>_>::cleanup
                (&this_00->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>,ctx);
      this_00 = (pointer)(this_00->stackBase + 0x40);
      lVar1 = lVar1 + -0x98;
    } while (lVar1 != 0);
    this_00 = this->data_;
  }
  if (this_00 != (pointer)this->firstElement) {
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }